

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O1

void __thiscall
optimization::graph_color::Graph_Color::init_conflict_map
          (Graph_Color *this,shared_ptr<optimization::livevar_analyse::Block_Live_Var> *blv,
          shared_ptr<optimization::graph_color::Conflict_Map> *conflict_map,
          set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          *cross_blk_vars)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  BasicBlk *pBVar3;
  element_type *peVar4;
  long lVar5;
  Conflict_Map *pCVar6;
  int iVar7;
  mapped_type *pmVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  _Rb_tree_header *p_Var11;
  _Base_ptr p_Var12;
  _Rb_tree_header *p_Var13;
  pointer puVar14;
  bool bVar15;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  cross_use_vars;
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  local_e8;
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  local_b8;
  VarId local_80;
  VarId local_70;
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  local_60;
  
  pBVar3 = ((blv->
            super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr)->block;
  puVar14 = (pBVar3->inst).
            super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (puVar14 !=
      (pBVar3->inst).
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var13 = &(cross_blk_vars->_M_t)._M_impl.super__Rb_tree_header;
    do {
      iVar7 = (**(code **)(*(long *)(puVar14->_M_t).
                                    super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                    .super__Head_base<0UL,_mir::inst::Inst_*,_false> + 8))();
      if (iVar7 != 7) {
        uVar2 = *(uint *)((long)(puVar14->_M_t).
                                super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                .super__Head_base<0UL,_mir::inst::Inst_*,_false> + 0x10);
        local_e8._M_impl._0_4_ = uVar2;
        pmVar8 = std::
                 map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                 ::at(((blv->
                       super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr)->vartable,(key_type_conflict *)&local_e8);
        iVar7 = (*(((pmVar8->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_Displayable)._vptr_Displayable[1])();
        if (iVar7 != 1) {
          p_Var10 = (cross_blk_vars->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var9 = &p_Var13->_M_header;
          for (; (_Rb_tree_header *)p_Var10 != (_Rb_tree_header *)0x0;
              p_Var10 = (&p_Var10->_M_left)[*(uint *)((long)(p_Var10 + 1) + 8) < uVar2]) {
            if (*(uint *)((long)(p_Var10 + 1) + 8) >= uVar2) {
              p_Var9 = p_Var10;
            }
          }
          p_Var11 = p_Var13;
          if (((_Rb_tree_header *)p_Var9 != p_Var13) &&
             (p_Var11 = (_Rb_tree_header *)p_Var9, uVar2 < *(uint *)((long)p_Var9 + 0x28))) {
            p_Var11 = p_Var13;
          }
          if (p_Var11 == p_Var13) {
            peVar4 = (conflict_map->
                     super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
            p_Var11 = &(peVar4->merged_var_Map)._M_t._M_impl.super__Rb_tree_header;
            p_Var10 = (peVar4->merged_var_Map)._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_parent;
            p_Var9 = &p_Var11->_M_header;
            for (; p_Var10 != (_Base_ptr)0x0; p_Var10 = (&p_Var10->_M_left)[bVar15]) {
              bVar15 = *(uint *)&p_Var10[1]._M_parent < uVar2;
              if (!bVar15) {
                p_Var9 = p_Var10;
              }
            }
            p_Var10 = &p_Var11->_M_header;
            if (((_Rb_tree_header *)p_Var9 != p_Var11) &&
               (p_Var10 = p_Var9, uVar2 < *(uint *)&p_Var9[1]._M_parent)) {
              p_Var10 = &p_Var11->_M_header;
            }
            if ((_Rb_tree_header *)p_Var10 == p_Var11) goto LAB_0013f0ce;
          }
          local_e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_e8._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_e8._M_impl.super__Rb_tree_header._M_header;
          local_e8._M_impl.super__Rb_tree_header._M_node_count = 0;
          lVar5 = *(long *)((long)(((blv->
                                    super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr)->instLiveVars).
                                  super__Vector_base<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start +
                           (((long)puVar14 -
                            (long)(pBVar3->inst).
                                  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) * 0x20000000 >> 0x1c));
          local_e8._M_impl.super__Rb_tree_header._M_header._M_right =
               local_e8._M_impl.super__Rb_tree_header._M_header._M_left;
          std::
          __set_intersection<std::_Rb_tree_const_iterator<mir::inst::VarId>,std::_Rb_tree_const_iterator<mir::inst::VarId>,std::insert_iterator<std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (*(undefined8 *)(lVar5 + 0x18),lVar5 + 8,
                     (cross_blk_vars->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,p_Var13,
                     &local_e8);
          pCVar6 = (conflict_map->
                   super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          local_70.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
          local_70.id = uVar2;
          std::
          _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          ::_Rb_tree(&local_60,&local_e8);
          Conflict_Map::add_conflict
                    (pCVar6,&local_70,
                     (set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                      *)&local_60);
          std::
          _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          ::~_Rb_tree(&local_60);
          std::
          _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          ::~_Rb_tree(&local_e8);
        }
      }
LAB_0013f0ce:
      puVar14 = puVar14 + 1;
    } while (puVar14 !=
             (pBVar3->inst).
             super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  p_Var10 = (cross_blk_vars->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var13 = &(cross_blk_vars->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var10 != p_Var13) {
    p_Var11 = &local_b8._M_impl.super__Rb_tree_header;
    do {
      uVar2 = *(uint *)&p_Var10[1]._M_parent;
      pCVar6 = (conflict_map->
               super___shared_ptr<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      p_Var1 = &(pCVar6->static_Map)._M_t._M_impl.super__Rb_tree_header;
      p_Var9 = (pCVar6->static_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var12 = &p_Var1->_M_header;
      for (; p_Var9 != (_Base_ptr)0x0; p_Var9 = (&p_Var9->_M_left)[bVar15]) {
        bVar15 = *(uint *)&p_Var9[1]._M_parent < uVar2;
        if (!bVar15) {
          p_Var12 = p_Var9;
        }
      }
      p_Var9 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var12 != p_Var1) &&
         (p_Var9 = p_Var12, uVar2 < *(uint *)&p_Var12[1]._M_parent)) {
        p_Var9 = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)p_Var9 == p_Var1) {
        local_80.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
        local_b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_b8._M_impl._0_8_ = 0;
        local_b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_b8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        local_b8._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_b8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var11->_M_header;
        local_b8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var11->_M_header;
        local_80.id = uVar2;
        Conflict_Map::add_conflict
                  (pCVar6,&local_80,
                   (set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                    *)&local_b8);
        std::
        _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
        ::~_Rb_tree(&local_b8);
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while ((_Rb_tree_header *)p_Var10 != p_Var13);
  }
  return;
}

Assistant:

void init_conflict_map(std::shared_ptr<livevar_analyse::Block_Live_Var> blv,
                         std::shared_ptr<Conflict_Map>& conflict_map,
                         std::set<mir::inst::VarId>& cross_blk_vars) {
    auto& block = blv->block;
    for (auto iter = block.inst.begin(); iter != block.inst.end(); ++iter) {
      if (iter->get()->inst_kind() == mir::inst::InstKind::Phi) {
        continue;
      }
      auto defVar = iter->get()->dest;
      if (blv->queryTy(defVar) == mir::types::TyKind::Void ||
          !cross_blk_vars.count(defVar) &&
              !conflict_map->merged_var_Map.count(defVar)) {
        continue;
      }
      int idx = iter - block.inst.begin();
      std::set<mir::inst::VarId> cross_use_vars;
      std::set_intersection(
          blv->instLiveVars[idx]->begin(), blv->instLiveVars[idx]->end(),
          cross_blk_vars.begin(), cross_blk_vars.end(),
          std::inserter(cross_use_vars, cross_use_vars.begin()));
      conflict_map->add_conflict(defVar, cross_use_vars);
    }
    for (auto var : cross_blk_vars) {
      if (!conflict_map->has_var(var)) {
        conflict_map->add_conflict(var, std::set<mir::inst::VarId>());
      }
    }
    // LOG(TRACE) << "conflict map : " << std::endl;
    // for (auto pair : conflict_map->dynamic_Map) {
    //   LOG(TRACE) << pair.first << " : ";
    //   for (auto var : pair.second) {
    //     LOG(TRACE) << var << ", ";
    //   }
    //   LOG(TRACE) << std::endl;
    // }
  }